

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isLookupResultValid
               (TextureCubeArrayView *texture,Sampler *sampler,LookupPrecision *prec,
               IVec4 *coordBits,Vec4 *coord,Vec2 *lodBounds,Vec4 *result)

{
  CubeFace CVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  FilterMode FVar7;
  ulong uVar8;
  long lVar9;
  int layerNdx;
  int layerNdx_00;
  int iVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 local_298 [12];
  int numPossibleFaces;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined1 local_278 [16];
  Vec2 *local_260;
  long local_258;
  Vec2 local_250;
  Vec3 layerCoord;
  CubeFace possibleFaces [6];
  ConstPixelBufferAccess faces [6];
  ConstPixelBufferAccess faces1 [6];
  
  if (texture->m_numLevels < 1) {
    iVar10 = -1;
  }
  else {
    iVar10 = (texture->m_levels->m_size).m_data[2] / 6 + -1;
  }
  fVar13 = coord->m_data[3];
  local_260 = lodBounds;
  local_278._0_4_ = TexVerifierUtil::computeFloatingPointError(fVar13,coordBits->m_data[3]);
  fVar12 = floorf((fVar13 - (float)local_278._0_4_) + 0.5);
  iVar11 = (int)fVar12;
  fVar13 = ceilf(fVar13 + (float)local_278._0_4_ + 0.5);
  iVar4 = (int)fVar13 + -1;
  layerNdx_00 = iVar10;
  if (iVar11 < iVar10) {
    layerNdx_00 = iVar11;
  }
  if (iVar11 < 0) {
    layerNdx_00 = 0;
  }
  if (iVar4 < iVar10) {
    iVar10 = iVar4;
  }
  if (iVar4 < 0) {
    iVar10 = 0;
  }
  layerCoord.m_data[2] = coord->m_data[2];
  layerCoord.m_data._0_8_ = *(undefined8 *)coord->m_data;
  numPossibleFaces = 0;
  TexVerifierUtil::getPossibleCubeFaces
            (&layerCoord,&prec->coordBits,possibleFaces,&numPossibleFaces);
  uVar8 = (ulong)(uint)numPossibleFaces;
  bVar3 = true;
  if (numPossibleFaces != 0) {
    for (; bVar3 = false, layerNdx_00 <= iVar10; layerNdx_00 = layerNdx_00 + 1) {
      if (0 < (int)uVar8) {
        local_258 = 0;
        do {
          CVar1 = possibleFaces[local_258];
          projectToFace((CubeFace)faces,(Vec3 *)(ulong)CVar1);
          local_298._4_4_ = faces[0].m_format.order;
          local_298._8_4_ = faces[0].m_format.type;
          local_288 = *(undefined8 *)local_260->m_data;
          fVar13 = sampler->lodThreshold;
          uStack_280 = 0;
          local_298._0_4_ = CVar1;
          if ((float)local_288 <= fVar13) {
            lVar9 = 0;
            do {
              ConstPixelBufferAccess::ConstPixelBufferAccess
                        ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar9 + -8));
              lVar9 = lVar9 + 0x28;
            } while (lVar9 != 0xf0);
            getCubeArrayLevelFaces((TextureCubeArrayView *)texture->m_levels,0,layerNdx_00,&faces);
            bVar3 = isCubeLevelSampleResultValid
                              (&faces,sampler,sampler->magFilter,prec,
                               (CubeFaceFloatCoords *)local_298,result);
            if (bVar3) {
              return true;
            }
          }
          fVar12 = local_288._4_4_;
          if (fVar13 < local_288._4_4_) {
            FVar7 = sampler->minFilter;
            iVar11 = texture->m_numLevels;
            iVar4 = iVar11 + -1;
            if (iVar4 < 1 || (FVar7 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) != 0) {
              if ((FVar7 == LINEAR_MIPMAP_NEAREST) || (FVar7 == NEAREST_MIPMAP_NEAREST)) {
                fVar13 = ceilf((float)local_288 + 0.5);
                iVar5 = (int)fVar13 + -1;
                iVar11 = iVar4;
                if (iVar5 < iVar4) {
                  iVar11 = iVar5;
                }
                if (iVar5 < 0) {
                  iVar11 = 0;
                }
                fVar13 = floorf(fVar12 + 0.5);
                iVar5 = (int)fVar13;
                if (iVar5 < iVar4) {
                  iVar4 = iVar5;
                }
                if (iVar5 < 0) {
                  iVar4 = 0;
                }
                for (; iVar11 <= iVar4; iVar11 = iVar11 + 1) {
                  lVar9 = 0;
                  do {
                    ConstPixelBufferAccess::ConstPixelBufferAccess
                              ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar9 + -8)
                              );
                    lVar9 = lVar9 + 0x28;
                  } while (lVar9 != 0xf0);
                  getCubeArrayLevelFaces
                            ((TextureCubeArrayView *)texture->m_levels,iVar11,layerNdx_00,&faces);
                  uVar6 = sampler->minFilter - LINEAR;
                  FVar7 = NEAREST;
                  if (uVar6 < 5) {
                    FVar7 = *(FilterMode *)(&DAT_00b96960 + (ulong)uVar6 * 4);
                  }
                  bVar3 = isCubeLevelSampleResultValid
                                    (&faces,sampler,FVar7,prec,(CubeFaceFloatCoords *)local_298,
                                     result);
                  if (bVar3) {
                    return true;
                  }
                }
              }
              else {
                lVar9 = 0;
                do {
                  ConstPixelBufferAccess::ConstPixelBufferAccess
                            ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar9 + -8));
                  lVar9 = lVar9 + 0x28;
                } while (lVar9 != 0xf0);
                getCubeArrayLevelFaces
                          ((TextureCubeArrayView *)texture->m_levels,0,layerNdx_00,&faces);
                bVar3 = isCubeLevelSampleResultValid
                                  (&faces,sampler,sampler->minFilter,prec,
                                   (CubeFaceFloatCoords *)local_298,result);
                if (bVar3) {
                  return true;
                }
              }
            }
            else {
              fVar13 = floorf((float)local_288);
              iVar5 = (int)fVar13;
              iVar11 = iVar11 + -2;
              iVar4 = iVar11;
              if (iVar5 < iVar11) {
                iVar4 = iVar5;
              }
              if (iVar5 < 0) {
                iVar4 = 0;
              }
              fVar13 = floorf(fVar12);
              iVar5 = (int)fVar13;
              if (iVar5 < iVar11) {
                iVar11 = iVar5;
              }
              if (iVar5 < 0) {
                iVar11 = 0;
              }
              while (iVar4 <= iVar11) {
                fVar13 = (float)iVar4;
                fVar12 = (float)local_288 - fVar13;
                fVar14 = local_288._4_4_ - fVar13;
                auVar2._4_4_ = fVar14;
                auVar2._0_4_ = fVar12;
                auVar2._8_4_ = (float)uStack_280 - fVar13;
                auVar2._12_4_ = uStack_280._4_4_ - fVar13;
                local_278 = minps(_DAT_00ad7f10,auVar2);
                lVar9 = 0;
                do {
                  ConstPixelBufferAccess::ConstPixelBufferAccess
                            ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar9 + -8));
                  lVar9 = lVar9 + 0x28;
                } while (lVar9 != 0xf0);
                lVar9 = 0;
                do {
                  ConstPixelBufferAccess::ConstPixelBufferAccess
                            ((ConstPixelBufferAccess *)((long)faces1[0].m_size.m_data + lVar9 + -8))
                  ;
                  lVar9 = lVar9 + 0x28;
                } while (lVar9 != 0xf0);
                getCubeArrayLevelFaces
                          ((TextureCubeArrayView *)texture->m_levels,iVar4,layerNdx_00,&faces);
                iVar4 = iVar4 + 1;
                getCubeArrayLevelFaces
                          ((TextureCubeArrayView *)texture->m_levels,iVar4,layerNdx_00,&faces1);
                uVar6 = sampler->minFilter - LINEAR;
                FVar7 = NEAREST;
                if (uVar6 < 5) {
                  FVar7 = *(FilterMode *)(&DAT_00b96960 + (ulong)uVar6 * 4);
                }
                local_250.m_data[0] = (float)(-(uint)(0.0 <= fVar12) & local_278._0_4_);
                local_250.m_data[1] = (float)(-(uint)(0.0 <= fVar14) & local_278._4_4_);
                bVar3 = isCubeMipmapLinearSampleResultValid
                                  (&faces,&faces1,sampler,FVar7,prec,
                                   (CubeFaceFloatCoords *)local_298,&local_250,result);
                if (bVar3) {
                  return true;
                }
              }
            }
          }
          local_258 = local_258 + 1;
          uVar8 = (ulong)numPossibleFaces;
        } while (local_258 < (long)uVar8);
      }
    }
  }
  return bVar3;
}

Assistant:

bool isLookupResultValid (const TextureCubeArrayView& texture, const Sampler& sampler, const LookupPrecision& prec, const IVec4& coordBits, const Vec4& coord, const Vec2& lodBounds, const Vec4& result)
{
	const IVec2	layerRange						= computeLayerRange(texture.getNumLayers(), coordBits.w(), coord.w());
	const Vec3	layerCoord						= coord.toWidth<3>();
	int			numPossibleFaces				= 0;
	CubeFace	possibleFaces[CUBEFACE_LAST];

	DE_ASSERT(isSamplerSupported(sampler));

	getPossibleCubeFaces(layerCoord, prec.coordBits, &possibleFaces[0], numPossibleFaces);

	if (numPossibleFaces == 0)
		return true; // Result is undefined.

	for (int layerNdx = layerRange.x(); layerNdx <= layerRange.y(); layerNdx++)
	{
		for (int tryFaceNdx = 0; tryFaceNdx < numPossibleFaces; tryFaceNdx++)
		{
			const CubeFaceFloatCoords	faceCoords		(possibleFaces[tryFaceNdx], projectToFace(possibleFaces[tryFaceNdx], layerCoord));
			const float					minLod			= lodBounds.x();
			const float					maxLod			= lodBounds.y();
			const bool					canBeMagnified	= minLod <= sampler.lodThreshold;
			const bool					canBeMinified	= maxLod > sampler.lodThreshold;

			if (canBeMagnified)
			{
				ConstPixelBufferAccess faces[CUBEFACE_LAST];
				getCubeArrayLevelFaces(texture, 0, layerNdx, faces);

				if (isCubeLevelSampleResultValid(faces, sampler, sampler.magFilter, prec, faceCoords, result))
					return true;
			}

			if (canBeMinified)
			{
				const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
				const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
				const int	minTexLevel		= 0;
				const int	maxTexLevel		= texture.getNumLevels()-1;

				DE_ASSERT(minTexLevel <= maxTexLevel);

				if (isLinearMipmap && minTexLevel < maxTexLevel)
				{
					const int	minLevel	= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
					const int	maxLevel	= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

					DE_ASSERT(minLevel <= maxLevel);

					for (int levelNdx = minLevel; levelNdx <= maxLevel; levelNdx++)
					{
						const float		minF	= de::clamp(minLod - float(levelNdx), 0.0f, 1.0f);
						const float		maxF	= de::clamp(maxLod - float(levelNdx), 0.0f, 1.0f);

						ConstPixelBufferAccess	faces0[CUBEFACE_LAST];
						ConstPixelBufferAccess	faces1[CUBEFACE_LAST];

						getCubeArrayLevelFaces(texture, levelNdx,		layerNdx,	faces0);
						getCubeArrayLevelFaces(texture, levelNdx + 1,	layerNdx,	faces1);

						if (isCubeMipmapLinearSampleResultValid(faces0, faces1, sampler, getLevelFilter(sampler.minFilter), prec, faceCoords, Vec2(minF, maxF), result))
							return true;
					}
				}
				else if (isNearestMipmap)
				{
					// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
					//		 decision to allow floor(lod + 0.5) as well.
					const int	minLevel	= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
					const int	maxLevel	= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

					DE_ASSERT(minLevel <= maxLevel);

					for (int levelNdx = minLevel; levelNdx <= maxLevel; levelNdx++)
					{
						ConstPixelBufferAccess faces[CUBEFACE_LAST];
						getCubeArrayLevelFaces(texture, levelNdx, layerNdx, faces);

						if (isCubeLevelSampleResultValid(faces, sampler, getLevelFilter(sampler.minFilter), prec, faceCoords, result))
							return true;
					}
				}
				else
				{
					ConstPixelBufferAccess faces[CUBEFACE_LAST];
					getCubeArrayLevelFaces(texture, 0, layerNdx, faces);

					if (isCubeLevelSampleResultValid(faces, sampler, sampler.minFilter, prec, faceCoords, result))
						return true;
				}
			}
		}
	}

	return false;
}